

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bels.c
# Opt level: O2

err_t belsGenM0(octet *m0,size_t len,gen_i ang,void *ang_state)

{
  size_t n;
  bool_t bVar1;
  size_t sVar2;
  u64 *dest;
  err_t eVar3;
  ulong uVar4;
  
  if (ang == (gen_i)0x0) {
    eVar3 = 0x131;
  }
  else {
    eVar3 = 0x6d;
    if ((len < 0x21) && ((0x101010000U >> (len & 0x3f) & 1) != 0)) {
      bVar1 = memIsValid(m0,len);
      if (bVar1 != 0) {
        n = (len >> 3) + 1;
        sVar2 = ppIsIrred_deep(n);
        dest = (u64 *)blobCreate(sVar2 + (len >> 3) + 1);
        if (dest == (u64 *)0x0) {
          eVar3 = 0x6e;
        }
        else {
          *(undefined8 *)((long)dest + len) = 1;
          uVar4 = ~(len * 0x180);
          do {
            uVar4 = uVar4 + 1;
            if (uVar4 == 0) {
              eVar3 = 0x131;
              goto LAB_0011617f;
            }
            (*ang)(dest,len,ang_state);
            u64From(dest,dest,len);
            bVar1 = ppIsIrred(dest,n,(void *)((long)dest + len + 8));
          } while (bVar1 == 0);
          u64To(m0,len,dest);
          eVar3 = 0;
LAB_0011617f:
          blobClose(dest);
        }
      }
    }
  }
  return eVar3;
}

Assistant:

err_t belsGenM0(octet m0[], size_t len, gen_i ang, void* ang_state)
{
	size_t n, reps;
	void* state;
	word* f0;
	void* stack;
	// проверить генератор
	if (ang == 0)
		return ERR_BAD_ANG;
	// проверить входные данные
	if ((len != 16 && len != 24 && len != 32) || 
		!memIsValid(m0, len))
		return ERR_BAD_INPUT;
	// создать состояние
	n = W_OF_O(len);
	state = blobCreate(n + 1 + ppIsIrred_deep(n + 1));
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// раскладка состояния
	f0 = (word*)state;
	stack = f0 + n + 1;
	// сгенерировать многочлен
	f0[n] = 1;
	for (reps = len * 8 * B_PER_IMPOSSIBLE * 3 / 4; reps--;)
	{
		ang(f0, len, ang_state);
		wwFrom(f0, f0, len);
		if (ppIsIrred(f0, n + 1, stack))
		{
			wwTo(m0, len, f0);
			break;
		}
	}
	// завершение
	blobClose(state);
	return reps != SIZE_MAX ? ERR_OK : ERR_BAD_ANG;
}